

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_mesh.cpp
# Opt level: O0

bool __thiscall
ON_SubD::Internal_GetTextureCoordinatesGeometryControlNetMesh
          (ON_SubD *this,ON_SubDLevel *level,ON_Mesh *mesh)

{
  bool bVar1;
  ON_2dVector ngon_sub_pack_rect_delta_00;
  ON_2dVector ngon_sub_pack_rect_size_00;
  ON_2dVector face_pack_rect_size_00;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ON_3dPoint *pOVar6;
  ON_3dPoint *pOVar7;
  ON_SubDVertex *this_00;
  ON_2dPoint *p;
  ON_2dVector *ngon_sub_pack_rect_delta_01;
  ulong uVar8;
  ON_2dVector OVar9;
  ON_2dPoint OVar10;
  ON_2fPoint local_5f8;
  int local_5f0;
  int local_5ec;
  int i_6;
  int count;
  ON_MappingTag mapping_tag;
  ON_2fPoint local_538;
  ON_2dPoint local_530;
  uint local_51c;
  undefined1 local_518 [4];
  uint i_5;
  undefined1 local_4fc [8];
  ON_3fVector N_1;
  double local_4e8;
  double local_4e0;
  ON_SubDVertex *v_1;
  ON_SubDFace *pOStack_4c8;
  uint i_4;
  ON_SubDFace *f_2;
  uint local_4b4;
  undefined1 auStack_4b0 [4];
  uint j;
  double local_4a8;
  double local_4a0;
  ON_3dPoint local_498;
  ON_3dPoint local_480;
  double local_468;
  double dStack_460;
  double local_458;
  double dStack_450;
  ON_2udex local_440;
  double local_438;
  double dStack_430;
  uint local_41c;
  double dStack_418;
  uint i_3;
  double dStack_410;
  ON_2udex local_400;
  ON_2udex ngon_grid_size;
  double local_3f0;
  double local_3e8;
  ON_3dPoint local_3e0;
  uint local_3c4;
  undefined1 local_3c0 [4];
  uint i_2;
  ON_2fPoint local_3a8;
  ON_2fPoint local_3a0;
  ON_3dPoint local_398;
  ON_2dPoint local_380;
  ON_3dPoint local_370;
  uint local_354;
  ON_MeshNgon *pOStack_350;
  uint i_1;
  ON_MeshNgon *four_gon;
  ON_2dVector local_340;
  ON_2dVector local_330;
  ON_2dPoint local_320;
  ON_2dPoint local_310;
  ON_3dPoint local_300;
  ON_3dPoint local_2e8;
  ON_3dPoint local_2d0;
  double dStack_2b8;
  ON_2dVector face_pack_rect_size;
  undefined1 local_28c [8];
  ON_3fVector N;
  ON_3dPoint local_268;
  undefined1 local_250 [8];
  ON_3dPoint C;
  ON_SubDVertex *v;
  uint i;
  ON_SubDFace *pOStack_218;
  uint n_1;
  ON_SubDFace *f_1;
  ON_SimpleArray<ON_3dPoint> P;
  ON_3dPoint faceT [2];
  ON_3dPoint quadT [4];
  ON_2dPoint quadS [4];
  ON_2dVector ngon_sub_pack_rect_delta;
  ON_2dVector ngon_sub_pack_rect_size;
  ON_3dPoint quadP [4];
  ON_2dPoint face_pack_rect_corners [4];
  undefined1 local_60 [8];
  ON_MeshFace mesh_f;
  ON_3dPointArray *D;
  uint mesh_vertex_count;
  uint n;
  ON_SubDFace *f;
  uint local_30;
  uint mesh_quad_count;
  uint mesh_4gon_count;
  bool bSubdivide;
  bool bSetMeshT;
  ON_Mesh *mesh_local;
  ON_SubDLevel *level_local;
  ON_SubD *this_local;
  
  uVar4 = TexturePointsAreSet(this);
  uVar5 = FaceCount(this);
  bVar1 = uVar5 < uVar4 << 1;
  bVar3 = false;
  local_30 = 0;
  f._4_4_ = 0;
  _mesh_vertex_count = level->m_face[0];
  do {
    if (_mesh_vertex_count == (ON_SubDFace *)0x0) {
      if (f._4_4_ == 0) {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
      }
      else {
        ON_SimpleArray<ON_MeshFace>::Reserve(&mesh->m_F,(ulong)f._4_4_);
        ON_SimpleArray<ON_MeshFace>::SetCount(&mesh->m_F,0);
        ON_SimpleArray<ON_3fVector>::Reserve
                  (&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,(ulong)f._4_4_);
        ON_SimpleArray<ON_3fVector>::SetCount(&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,0);
        uVar4 = f._4_4_ * 4 + local_30 * -7;
        mesh_f.vi._8_8_ = ON_Mesh::DoublePrecisionVertices(mesh);
        ON_SimpleArray<ON_3dPoint>::Reserve
                  ((ON_SimpleArray<ON_3dPoint> *)mesh_f.vi._8_8_,(ulong)uVar4);
        ON_SimpleArray<ON_3dPoint>::SetCount((ON_SimpleArray<ON_3dPoint> *)mesh_f.vi._8_8_,0);
        ON_SimpleArray<ON_3fVector>::Reserve
                  (&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,(ulong)uVar4);
        ON_SimpleArray<ON_3fVector>::SetCount(&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,0);
        ON_SimpleArray<ON_2dPoint>::Reserve
                  (&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,(ulong)uVar4);
        ON_SimpleArray<ON_2dPoint>::SetCount(&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,0);
        if (bVar1) {
          ON_SimpleArray<ON_2fPoint>::Reserve
                    (&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,(ulong)uVar4);
        }
        ON_SimpleArray<ON_2fPoint>::SetCount(&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,0);
        ON_SimpleArray<ON_MeshFace>::Reserve(&mesh->m_F,(ulong)f._4_4_);
        ON_SimpleArray<ON_MeshFace>::SetCount(&mesh->m_F,0);
        ON_SimpleArray<ON_3fVector>::Reserve
                  (&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,(ulong)f._4_4_);
        ON_SimpleArray<ON_3fVector>::SetCount(&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,0);
        if (bVar3) {
          ngon_sub_pack_rect_delta.y = ON_2dVector::NanVector.x;
          ngon_sub_pack_rect_size.x = ON_2dVector::NanVector.y;
          quadS[3].y = ON_2dVector::NanVector.x;
          ngon_sub_pack_rect_delta.x = ON_2dVector::NanVector.y;
          quadT[3].z = ON_2dPoint::NanPoint.x;
          quadS[0].x = ON_2dPoint::NanPoint.y;
          quadS[0].y = ON_2dPoint::NanPoint.x;
          quadS[1].x = ON_2dPoint::NanPoint.y;
          quadS[1].y = ON_2dPoint::NanPoint.x;
          quadS[2].x = ON_2dPoint::NanPoint.y;
          quadS[2].y = ON_2dPoint::NanPoint.x;
          quadS[3].x = ON_2dPoint::NanPoint.y;
          faceT[1].z = ON_3dPoint::NanPoint.x;
          quadT[0].x = ON_3dPoint::NanPoint.y;
          quadT[0].y = ON_3dPoint::NanPoint.z;
          quadT[0].z = ON_3dPoint::NanPoint.x;
          quadT[1].x = ON_3dPoint::NanPoint.y;
          quadT[1].y = ON_3dPoint::NanPoint.z;
          quadT[1].z = ON_3dPoint::NanPoint.x;
          quadT[2].x = ON_3dPoint::NanPoint.y;
          quadT[2].y = ON_3dPoint::NanPoint.z;
          quadT[2].z = ON_3dPoint::NanPoint.x;
          quadT[3].x = ON_3dPoint::NanPoint.y;
          quadT[3].y = ON_3dPoint::NanPoint.z;
          P._16_8_ = ON_3dPoint::NanPoint.x;
          faceT[0].x = ON_3dPoint::NanPoint.y;
          faceT[0].y = ON_3dPoint::NanPoint.z;
          faceT[0].z = ON_3dPoint::NanPoint.x;
          faceT[1].x = ON_3dPoint::NanPoint.y;
          faceT[1].y = ON_3dPoint::NanPoint.z;
          ON_SimpleArray<ON_3dPoint>::ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)&f_1,0x40);
          for (pOStack_218 = level->m_face[0]; pOStack_218 != (ON_SubDFace *)0x0;
              pOStack_218 = pOStack_218->m_next_face) {
            uVar4 = (uint)pOStack_218->m_edge_count;
            if (2 < uVar4) {
              ON_SimpleArray<ON_3dPoint>::SetCount((ON_SimpleArray<ON_3dPoint> *)&f_1,0);
              v._0_4_ = 0;
              while (((uint)v < uVar4 &&
                     (C.z = (double)ON_SubDFace::Vertex(pOStack_218,(uint)v),
                     (ON_SubDVertex *)C.z != (ON_SubDVertex *)0x0))) {
                ON_SubDVertex::ControlNetPoint((ON_3dPoint *)local_250,(ON_SubDVertex *)C.z);
                bVar3 = ON_3dPoint::IsValid((ON_3dPoint *)local_250);
                if (!bVar3) break;
                ON_SubDVertex::ControlNetPoint(&local_268,(ON_SubDVertex *)C.z);
                ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)&f_1,&local_268);
                v._0_4_ = (uint)v + 1;
              }
              uVar5 = ON_SimpleArray<ON_3dPoint>::UnsignedCount((ON_SimpleArray<ON_3dPoint> *)&f_1);
              if (uVar4 == uVar5) {
                ON_SubDFace::ControlNetCenterPoint((ON_3dPoint *)&N.y,pOStack_218);
                ngon_sub_pack_rect_size.y = (double)N._4_8_;
                bVar3 = ON_3dPoint::IsValid((ON_3dPoint *)&ngon_sub_pack_rect_size.y);
                ngon_sub_pack_rect_delta_01 = (ON_2dVector *)(ulong)bVar3;
                if (bVar3) {
                  ON_SubDFace::ControlNetCenterNormal
                            ((ON_3dVector *)&face_pack_rect_size.y,pOStack_218);
                  ON_3fVector::ON_3fVector
                            ((ON_3fVector *)local_28c,(ON_3dVector *)&face_pack_rect_size.y);
                  ON_SubDFace::GetFacePackRectCorners(pOStack_218,false,(ON_2dPoint *)&quadP[3].z);
                  OVar9 = ON_SubDFace::PackRectSize(pOStack_218);
                  face_pack_rect_size.x = OVar9.y;
                  dStack_2b8 = OVar9.x;
                  if (bVar1) {
                    ON_SubDFace::TexturePoint(&local_2d0,pOStack_218,uVar4 - 1);
                    faceT[0].y = local_2d0.z;
                    P._16_8_ = local_2d0.x;
                    faceT[0].x = local_2d0.y;
                    ON_SubDFace::TexturePoint(&local_2e8,pOStack_218,0);
                    faceT[1].y = local_2e8.z;
                    faceT[0].z = local_2e8.x;
                    faceT[1].x = local_2e8.y;
                    ON_SubDFace::TextureCenterPoint(&local_300,pOStack_218);
                    faceT[1].z = local_300.x;
                    quadT[0].x = local_300.y;
                    quadT[0].y = local_300.z;
                  }
                  if (uVar4 == 4) {
                    local_60._0_4_ =
                         ON_SimpleArray<ON_3dPoint>::UnsignedCount
                                   ((ON_SimpleArray<ON_3dPoint> *)mesh_f.vi._8_8_);
                    ON_SimpleArray<ON_3dPoint>::Append
                              ((ON_SimpleArray<ON_3dPoint> *)mesh_f.vi._8_8_,
                               (ON_3dPoint *)&ngon_sub_pack_rect_size.y);
                    ON_SimpleArray<ON_3fVector>::Append
                              (&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,
                               (ON_3fVector *)local_28c);
                    OVar10 = ON_SubDFace::PackRectOrigin(pOStack_218);
                    local_320.y = OVar10.y;
                    local_320.x = OVar10.x;
                    OVar9 = ON_SubDFace::PackRectSize(pOStack_218);
                    local_340.y = OVar9.y;
                    local_340.x = OVar9.x;
                    OVar9 = ::operator*(0.5,&local_340);
                    local_330.y = OVar9.y;
                    local_330.x = OVar9.x;
                    OVar10 = ON_2dPoint::operator+(&local_320,&local_330);
                    local_310.y = OVar10.y;
                    local_310.x = OVar10.x;
                    ON_SimpleArray<ON_2dPoint>::Append
                              (&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,&local_310);
                    if (bVar1) {
                      ON_2fPoint::ON_2fPoint((ON_2fPoint *)&four_gon,(ON_3dPoint *)&faceT[1].z);
                      ON_SimpleArray<ON_2fPoint>::Append
                                (&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,
                                 (ON_2fPoint *)&four_gon);
                    }
                    pOStack_350 = ON_Mesh::AllocateNgon(mesh,8,4);
                    uVar4 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                                      ((ON_SimpleArray<ON_3dPoint> *)mesh_f.vi._8_8_);
                    *pOStack_350->m_vi = uVar4;
                    pOStack_350->m_vi[1] = *pOStack_350->m_vi + 1;
                    pOStack_350->m_vi[2] = *pOStack_350->m_vi + 2;
                    pOStack_350->m_vi[3] = *pOStack_350->m_vi + 3;
                    pOStack_350->m_vi[4] = *pOStack_350->m_vi + 4;
                    pOStack_350->m_vi[5] = *pOStack_350->m_vi + 5;
                    pOStack_350->m_vi[6] = *pOStack_350->m_vi + 6;
                    pOStack_350->m_vi[7] = *pOStack_350->m_vi + 7;
                    uVar4 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&mesh->m_F);
                    *pOStack_350->m_fi = uVar4;
                    pOStack_350->m_fi[1] = *pOStack_350->m_fi + 1;
                    pOStack_350->m_fi[2] = *pOStack_350->m_fi + 2;
                    pOStack_350->m_fi[3] = *pOStack_350->m_fi + 3;
                    for (local_354 = 0; uVar2 = mesh_f.vi._8_8_, local_354 < 4;
                        local_354 = local_354 + 1) {
                      pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                                         ((ON_SimpleArray<ON_3dPoint> *)&f_1,local_354);
                      ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)uVar2,pOVar6)
                      ;
                      uVar2 = mesh_f.vi._8_8_;
                      pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                                         ((ON_SimpleArray<ON_3dPoint> *)&f_1,local_354);
                      pOVar7 = ON_SimpleArray<ON_3dPoint>::operator[]
                                         ((ON_SimpleArray<ON_3dPoint> *)&f_1,local_354 + 1 & 3);
                      ON_3dPoint::Midpoint(&local_370,pOVar6,pOVar7);
                      ON_SimpleArray<ON_3dPoint>::Append
                                ((ON_SimpleArray<ON_3dPoint> *)uVar2,&local_370);
                      ON_SimpleArray<ON_3fVector>::Append
                                (&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,
                                 (ON_3fVector *)local_28c);
                      ON_SimpleArray<ON_3fVector>::Append
                                (&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,
                                 (ON_3fVector *)local_28c);
                      ON_SimpleArray<ON_2dPoint>::Append
                                (&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,
                                 (ON_2dPoint *)&face_pack_rect_corners[(ulong)local_354 - 1].y);
                      OVar10 = ON_2dPoint::Midpoint
                                         ((ON_2dPoint *)
                                          &face_pack_rect_corners[(ulong)local_354 - 1].y,
                                          (ON_2dPoint *)
                                          ((long)&quadP[3].z + (ulong)((local_354 + 1 & 3) << 4)));
                      local_380.y = OVar10.y;
                      local_380.x = OVar10.x;
                      ON_SimpleArray<ON_2dPoint>::Append
                                (&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,&local_380);
                      if (bVar1) {
                        faceT[0].y = faceT[1].y;
                        P._16_8_ = faceT[0].z;
                        faceT[0].x = faceT[1].x;
                        ON_SubDFace::TexturePoint(&local_398,pOStack_218,local_354 + 1 & 3);
                        faceT[1].y = local_398.z;
                        faceT[0].z = local_398.x;
                        faceT[1].x = local_398.y;
                        ON_2fPoint::ON_2fPoint(&local_3a0,(ON_3dPoint *)&P.m_count);
                        ON_SimpleArray<ON_2fPoint>::Append
                                  (&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,&local_3a0);
                        ON_3dPoint::Midpoint
                                  ((ON_3dPoint *)local_3c0,(ON_3dPoint *)&P.m_count,
                                   (ON_3dPoint *)&faceT[0].z);
                        ON_2fPoint::ON_2fPoint(&local_3a8,(ON_3dPoint *)local_3c0);
                        ON_SimpleArray<ON_2fPoint>::Append
                                  (&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,&local_3a8);
                      }
                    }
                    mesh_f.vi[1] = pOStack_350->m_vi[7];
                    for (local_3c4 = 0; local_3c4 < 4; local_3c4 = local_3c4 + 1) {
                      local_60._4_4_ = mesh_f.vi[1];
                      mesh_f.vi[0] = pOStack_350->m_vi[local_3c4 * 2];
                      mesh_f.vi[1] = mesh_f.vi[0] + 1;
                      ON_SimpleArray<ON_MeshFace>::Append(&mesh->m_F,(ON_MeshFace *)local_60);
                      ON_SimpleArray<ON_3fVector>::Append
                                (&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,
                                 (ON_3fVector *)local_28c);
                    }
                    ON_Mesh::AddNgon(mesh,pOStack_350);
                  }
                  else {
                    pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                                       ((ON_SimpleArray<ON_3dPoint> *)&f_1,uVar4 - 1);
                    pOVar7 = ON_SimpleArray<ON_3dPoint>::operator[]
                                       ((ON_SimpleArray<ON_3dPoint> *)&f_1,0);
                    ON_3dPoint::Midpoint(&local_3e0,pOVar6,pOVar7);
                    quadP[2].z = local_3e0.x;
                    quadP[3].x = local_3e0.y;
                    quadP[3].y = local_3e0.z;
                    if (bVar1) {
                      ON_3dPoint::Midpoint
                                ((ON_3dPoint *)&ngon_grid_size,(ON_3dPoint *)&P.m_count,
                                 (ON_3dPoint *)&faceT[0].z);
                      quadT[2].z = (double)ngon_grid_size;
                      quadT[3].x = local_3f0;
                      quadT[3].y = local_3e8;
                    }
                    if (uVar4 < 5) {
                      local_400 = ON_2udex::Zero;
                    }
                    else {
                      dStack_418 = dStack_2b8;
                      dStack_410 = face_pack_rect_size.x;
                      OVar9.y = face_pack_rect_size.x;
                      OVar9.x = dStack_2b8;
                      local_400 = ON_SubDFace::GetNgonSubPackRectSizeAndDelta
                                            ((ON_SubDFace *)(ulong)uVar4,
                                             (int)&ngon_sub_pack_rect_delta + 8,OVar9,
                                             (ON_2dVector *)&quadS[3].y,ngon_sub_pack_rect_delta_01)
                      ;
                    }
                    for (local_41c = 0; local_41c < uVar4; local_41c = local_41c + 1) {
                      if (uVar4 == 3) {
                        ON_SubDMeshFragment::Get3gonFaceFragmentPackRectCorners
                                  (false,(ON_2dPoint *)&quadP[3].z,local_41c,false,
                                   (ON_2dPoint *)&quadT[3].z);
                      }
                      else {
                        local_438 = dStack_2b8;
                        dStack_430 = face_pack_rect_size.x;
                        local_440 = local_400;
                        local_458 = ngon_sub_pack_rect_delta.y;
                        dStack_450 = ngon_sub_pack_rect_size.x;
                        local_468 = quadS[3].y;
                        dStack_460 = ngon_sub_pack_rect_delta.x;
                        face_pack_rect_size_00.y = face_pack_rect_size.x;
                        face_pack_rect_size_00.x = dStack_2b8;
                        ngon_sub_pack_rect_size_00.y = ngon_sub_pack_rect_size.x;
                        ngon_sub_pack_rect_size_00.x = ngon_sub_pack_rect_delta.y;
                        ngon_sub_pack_rect_delta_00.y = ngon_sub_pack_rect_delta.x;
                        ngon_sub_pack_rect_delta_00.x = quadS[3].y;
                        ON_SubDMeshFragment::GetNgonFaceFragmentPackRectCorners
                                  (uVar4,local_41c,false,(ON_2dPoint *)&quadP[3].z,
                                   face_pack_rect_size_00,local_400,ngon_sub_pack_rect_size_00,
                                   ngon_sub_pack_rect_delta_00,(ON_2dPoint *)&quadT[3].z);
                      }
                      quadP[1].y = quadP[3].y;
                      quadP[0].z = quadP[2].z;
                      quadP[1].x = quadP[3].x;
                      pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                                         ((ON_SimpleArray<ON_3dPoint> *)&f_1,local_41c);
                      quadP[2].y = pOVar6->z;
                      quadP[1].z = pOVar6->x;
                      quadP[2].x = pOVar6->y;
                      pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                                         ((ON_SimpleArray<ON_3dPoint> *)&f_1,local_41c);
                      pOVar7 = ON_SimpleArray<ON_3dPoint>::operator[]
                                         ((ON_SimpleArray<ON_3dPoint> *)&f_1,(local_41c + 1) % uVar4
                                         );
                      ON_3dPoint::Midpoint(&local_480,pOVar6,pOVar7);
                      quadP[2].z = local_480.x;
                      quadP[3].x = local_480.y;
                      quadP[3].y = local_480.z;
                      if (bVar1) {
                        faceT[0].y = faceT[1].y;
                        P._16_8_ = faceT[0].z;
                        faceT[0].x = faceT[1].x;
                        ON_SubDFace::TexturePoint(&local_498,pOStack_218,(local_41c + 1) % uVar4);
                        faceT[1].y = local_498.z;
                        faceT[0].z = local_498.x;
                        faceT[1].x = local_498.y;
                        quadT[1].y = quadT[3].y;
                        quadT[0].z = quadT[2].z;
                        quadT[1].x = quadT[3].x;
                        quadT[2].y = faceT[0].y;
                        quadT[1].z = (double)P._16_8_;
                        quadT[2].x = faceT[0].x;
                        ON_3dPoint::Midpoint
                                  ((ON_3dPoint *)auStack_4b0,(ON_3dPoint *)&P.m_count,
                                   (ON_3dPoint *)&faceT[0].z);
                        quadT[2].z = _auStack_4b0;
                        quadT[3].x = local_4a8;
                        quadT[3].y = local_4a0;
                      }
                      local_60._0_4_ =
                           ON_SimpleArray<ON_3dPoint>::UnsignedCount
                                     ((ON_SimpleArray<ON_3dPoint> *)mesh_f.vi._8_8_);
                      local_60._4_4_ = local_60._0_4_ + 1;
                      mesh_f.vi[0] = local_60._0_4_ + 2;
                      mesh_f.vi[1] = local_60._0_4_ + 3;
                      for (local_4b4 = 0; local_4b4 < 4; local_4b4 = local_4b4 + 1) {
                        ON_SimpleArray<ON_3dPoint>::Append
                                  ((ON_SimpleArray<ON_3dPoint> *)mesh_f.vi._8_8_,
                                   (ON_3dPoint *)&quadP[(ulong)local_4b4 - 1].z);
                        ON_SimpleArray<ON_3fVector>::Append
                                  (&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,
                                   (ON_3fVector *)local_28c);
                        ON_SimpleArray<ON_2dPoint>::Append
                                  (&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,
                                   (ON_2dPoint *)&quadS[(ulong)local_4b4 - 1].y);
                        if (bVar1) {
                          ON_2fPoint::ON_2fPoint
                                    ((ON_2fPoint *)((long)&f_2 + 4),
                                     (ON_3dPoint *)&faceT[(ulong)local_4b4 + 1].z);
                          ON_SimpleArray<ON_2fPoint>::Append
                                    (&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,
                                     (ON_2fPoint *)((long)&f_2 + 4));
                        }
                      }
                      ON_SimpleArray<ON_MeshFace>::Append(&mesh->m_F,(ON_MeshFace *)local_60);
                      ON_SimpleArray<ON_3fVector>::Append
                                (&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,
                                 (ON_3fVector *)local_28c);
                    }
                  }
                }
              }
            }
          }
          ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)&f_1);
        }
        else {
          for (pOStack_4c8 = level->m_face[0]; pOStack_4c8 != (ON_SubDFace *)0x0;
              pOStack_4c8 = pOStack_4c8->m_next_face) {
            if (pOStack_4c8->m_edge_count == 4) {
              quadP[2].z = ON_DBL_QNAN;
              v_1._4_4_ = 0;
              while ((v_1._4_4_ < 4 &&
                     (this_00 = ON_SubDFace::Vertex(pOStack_4c8,v_1._4_4_),
                     this_00 != (ON_SubDVertex *)0x0))) {
                ON_SubDVertex::ControlNetPoint((ON_3dPoint *)&N_1.y,this_00);
                uVar8 = (ulong)v_1._4_4_;
                quadP[uVar8 - 1].z = (double)N_1._4_8_;
                quadP[uVar8].x = local_4e8;
                quadP[uVar8].y = local_4e0;
                bVar3 = ON_3dPoint::IsValid((ON_3dPoint *)&quadP[(ulong)v_1._4_4_ - 1].z);
                if (!bVar3) break;
                v_1._4_4_ = v_1._4_4_ + 1;
              }
              bVar3 = ON_3dPoint::IsValid((ON_3dPoint *)&quadP[2].z);
              if (bVar3) {
                ON_SubDFace::ControlNetCenterNormal((ON_3dVector *)local_518,pOStack_4c8);
                ON_3fVector::ON_3fVector((ON_3fVector *)local_4fc,(ON_3dVector *)local_518);
                local_60._0_4_ =
                     ON_SimpleArray<ON_3dPoint>::UnsignedCount
                               ((ON_SimpleArray<ON_3dPoint> *)mesh_f.vi._8_8_);
                local_60._4_4_ = local_60._0_4_ + 1;
                mesh_f.vi[0] = local_60._0_4_ + 2;
                mesh_f.vi[1] = local_60._0_4_ + 3;
                ON_SimpleArray<ON_MeshFace>::Append(&mesh->m_F,(ON_MeshFace *)local_60);
                ON_SimpleArray<ON_3fVector>::Append
                          (&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)local_4fc)
                ;
                for (local_51c = 0; local_51c < 4; local_51c = local_51c + 1) {
                  ON_SimpleArray<ON_3dPoint>::Append
                            ((ON_SimpleArray<ON_3dPoint> *)mesh_f.vi._8_8_,
                             (ON_3dPoint *)&quadP[(ulong)local_51c - 1].z);
                  ON_SimpleArray<ON_3fVector>::Append
                            (&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)local_4fc
                            );
                  OVar10 = ON_SubDFace::PackRectCorner(pOStack_4c8,false,local_51c);
                  local_530.y = OVar10.y;
                  local_530.x = OVar10.x;
                  ON_SimpleArray<ON_2dPoint>::Append
                            (&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,&local_530);
                  if (bVar1) {
                    ON_SubDFace::TexturePoint
                              ((ON_3dPoint *)(mapping_tag.m_mesh_xform.m_xform[3] + 3),pOStack_4c8,
                               local_51c);
                    ON_2fPoint::ON_2fPoint
                              (&local_538,(ON_3dPoint *)(mapping_tag.m_mesh_xform.m_xform[3] + 3));
                    ON_SimpleArray<ON_2fPoint>::Append
                              (&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,&local_538);
                  }
                }
              }
            }
          }
        }
        TextureMappingTag((ON_MappingTag *)&i_6,this,false);
        uVar4 = ON_SimpleArray<ON_2dPoint>::UnsignedCount
                          (&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>);
        uVar5 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                          ((ON_SimpleArray<ON_3dPoint> *)mesh_f.vi._8_8_);
        if (uVar4 == uVar5) {
          *(double *)&mesh->field_0x240 = ON_Interval::ZeroToOne.m_t[0];
          *(double *)&mesh->field_0x248 = ON_Interval::ZeroToOne.m_t[1];
          *(double *)&mesh->field_0x250 = ON_Interval::ZeroToOne.m_t[0];
          *(double *)&mesh->field_0x258 = ON_Interval::ZeroToOne.m_t[1];
          mesh->m_srf_scale[0] = 0.0;
          mesh->m_srf_scale[1] = 0.0;
          *(double *)&mesh->field_0x270 = ON_Interval::ZeroToOne.m_t[0];
          *(double *)&mesh->field_0x278 = ON_Interval::ZeroToOne.m_t[1];
          *(double *)&mesh->field_0x280 = ON_Interval::ZeroToOne.m_t[0];
          *(double *)&mesh->field_0x288 = ON_Interval::ZeroToOne.m_t[1];
          mesh->m_packed_tex_rotate = false;
          if ((!bVar1) &&
             ((bVar3 = ON_MappingTag::IsSet((ON_MappingTag *)&i_6), !bVar3 ||
              (bVar3 = ON_MappingTag::IsDefaultSurfaceParameterMapping((ON_MappingTag *)&i_6), bVar3
              )))) {
            local_5ec = ON_SimpleArray<ON_2dPoint>::Count
                                  (&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>);
            ON_SimpleArray<ON_2fPoint>::Reserve
                      (&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,(long)local_5ec);
            ON_SimpleArray<ON_2fPoint>::SetCount(&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,0);
            for (local_5f0 = 0; local_5f0 < local_5ec; local_5f0 = local_5f0 + 1) {
              p = ON_SimpleArray<ON_2dPoint>::operator[]
                            (&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,local_5f0);
              ON_2fPoint::ON_2fPoint(&local_5f8,p);
              ON_SimpleArray<ON_2fPoint>::Append
                        (&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,&local_5f8);
            }
          }
        }
        else {
          ON_SimpleArray<ON_2dPoint>::Destroy(&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>);
          if (mapping_tag.m_mapping_id.Data4._0_4_ == 1) {
            memcpy(&i_6,&ON_MappingTag::Unset,0x98);
          }
        }
        if (bVar1) {
          uVar4 = ON_SimpleArray<ON_2fPoint>::UnsignedCount
                            (&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
          uVar5 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                            ((ON_SimpleArray<ON_3dPoint> *)mesh_f.vi._8_8_);
          if (uVar4 != uVar5) {
            ON_SimpleArray<ON_2fPoint>::Destroy(&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
          }
        }
        memcpy(&mesh->m_Ttag,&i_6,0x98);
        this_local._7_1_ = true;
      }
      return this_local._7_1_;
    }
    uVar4 = ON_SubDFace::EdgeCount(_mesh_vertex_count);
    if (2 < uVar4) {
      if (!bVar3) {
        if (uVar4 == 4) {
          f._4_4_ = f._4_4_ + 1;
          goto LAB_00914b99;
        }
        bVar3 = true;
        local_30 = f._4_4_;
        f._4_4_ = f._4_4_ << 2;
      }
      if (uVar4 == 4) {
        local_30 = local_30 + 1;
      }
      f._4_4_ = uVar4 + f._4_4_;
    }
LAB_00914b99:
    _mesh_vertex_count = _mesh_vertex_count->m_next_face;
  } while( true );
}

Assistant:

bool ON_SubD::Internal_GetTextureCoordinatesGeometryControlNetMesh(
  const ON_SubDLevel& level,
  ON_Mesh& mesh
) const
{
  const bool bSetMeshT = 2 * this->TexturePointsAreSet() > this->FaceCount(); // more than half the faces have texture points.

  bool bSubdivide = false; // required if any SubD faces are not quads.
  unsigned mesh_4gon_count = 0;
  unsigned mesh_quad_count = 0;
  for (const ON_SubDFace* f = level.m_face[0]; nullptr != f; f = f->m_next_face)
  {
    const unsigned n = f->EdgeCount();
    if (n < 3)
      continue;

    if (false == bSubdivide)
    {
      if (4 == n)
      {
        // subdivision is not required and we have another quad face
        ++mesh_quad_count;
        continue;
      }
      // first non-quad SubD face - switch to subdivided case
      bSubdivide = true;

      // each of the previously counted quad faces will generate 9 mesh vertices, 4 mesh faces, and a single ON_MeshNgon.
      mesh_4gon_count = mesh_quad_count;
      mesh_quad_count *= 4;
    }

    // In the subdivided case, each SubD face is represented by n quads in the ON_Mesh.
    if ( 4 == n)
      ++mesh_4gon_count;
    mesh_quad_count += n;
  }

  if (mesh_quad_count < 1)
    return ON_SUBD_RETURN_ERROR(false);

  mesh.m_F.Reserve(mesh_quad_count);
  mesh.m_F.SetCount(0);
  mesh.m_FN.Reserve(mesh_quad_count);
  mesh.m_FN.SetCount(0);

  const unsigned mesh_vertex_count = 4 * (mesh_quad_count - 4* mesh_4gon_count) + 9 * mesh_4gon_count;
  ON_3dPointArray& D = mesh.DoublePrecisionVertices();
  D.Reserve(mesh_vertex_count);
  D.SetCount(0);
  mesh.m_N.Reserve(mesh_vertex_count);
  mesh.m_N.SetCount(0);
  mesh.m_S.Reserve(mesh_vertex_count);
  mesh.m_S.SetCount(0);
  if (bSetMeshT)
    mesh.m_T.Reserve(mesh_vertex_count);
  mesh.m_T.SetCount(0);

  mesh.m_F.Reserve(mesh_quad_count);
  mesh.m_F.SetCount(0);
  mesh.m_FN.Reserve(mesh_quad_count);
  mesh.m_FN.SetCount(0);

  ON_MeshFace mesh_f;
  ON_2dPoint face_pack_rect_corners[4];
  ON_3dPoint quadP[4];
  if (bSubdivide)
  {
    ON_2dVector ngon_sub_pack_rect_size = ON_2dVector::NanVector;
    ON_2dVector ngon_sub_pack_rect_delta = ON_2dVector::NanVector;
    ON_2dPoint quadS[4] = { ON_2dPoint::NanPoint, ON_2dPoint::NanPoint, ON_2dPoint::NanPoint, ON_2dPoint::NanPoint };
    ON_3dPoint quadT[4] = { ON_3dPoint::NanPoint, ON_3dPoint::NanPoint, ON_3dPoint::NanPoint, ON_3dPoint::NanPoint };
    ON_3dPoint faceT[2] = { ON_3dPoint ::NanPoint, ON_3dPoint::NanPoint };


    ON_SimpleArray<ON_3dPoint> P(64);
    for (const ON_SubDFace* f = level.m_face[0]; nullptr != f; f = f->m_next_face)
    {
      const unsigned n = f->m_edge_count;
      if (n < 3)
        continue;

      P.SetCount(0);
      for (unsigned i = 0; i < n; ++i)
      {
        const ON_SubDVertex* v = f->Vertex(i);
        if (nullptr == v)
          break;
        const ON_3dPoint C = v->ControlNetPoint();
        if (false == C.IsValid())
          break;
        P.Append(v->ControlNetPoint());
      }
      if (n != P.UnsignedCount())
        continue;

      quadP[0] = f->ControlNetCenterPoint();
      if (false == quadP[0].IsValid())
        continue;

      const ON_3fVector N(f->ControlNetCenterNormal());

      f->GetFacePackRectCorners(false, face_pack_rect_corners);
      const ON_2dVector face_pack_rect_size = f->PackRectSize();

      if (bSetMeshT)
      {
        faceT[0] = f->TexturePoint(n - 1);
        faceT[1] = f->TexturePoint(0);
        quadT[0] = f->TextureCenterPoint();
      }


      if (4 == n)
      {
        // An ON_SubDFace quad becomes an ON_Mesh ngon made from 4 ON_Mesh quads.

        // center point
        mesh_f.vi[0] = D.UnsignedCount();
        D.Append(quadP[0]);
        mesh.m_N.Append(N);
        mesh.m_S.Append(f->PackRectOrigin() + 0.5 * f->PackRectSize());
        if (bSetMeshT)
          mesh.m_T.Append(ON_2fPoint(quadT[0]));

        ON_MeshNgon* four_gon = mesh.AllocateNgon(8,4);
        four_gon->m_vi[0] = D.UnsignedCount();
        four_gon->m_vi[1] = four_gon->m_vi[0] + 1;
        four_gon->m_vi[2] = four_gon->m_vi[0] + 2;
        four_gon->m_vi[3] = four_gon->m_vi[0] + 3;
        four_gon->m_vi[4] = four_gon->m_vi[0] + 4;
        four_gon->m_vi[5] = four_gon->m_vi[0] + 5;
        four_gon->m_vi[6] = four_gon->m_vi[0] + 6;
        four_gon->m_vi[7] = four_gon->m_vi[0] + 7;

        four_gon->m_fi[0] = mesh.m_F.UnsignedCount();
        four_gon->m_fi[1] = four_gon->m_fi[0] + 1;
        four_gon->m_fi[2] = four_gon->m_fi[0] + 2;
        four_gon->m_fi[3] = four_gon->m_fi[0] + 3;

        // add 8 boundary vertices
        for (unsigned i = 0; i < 4; ++i)
        {
          D.Append(P[i]);
          D.Append(ON_3dPoint::Midpoint(P[i], P[(i + 1) % 4]));
          mesh.m_N.Append(N);
          mesh.m_N.Append(N);
          mesh.m_S.Append(face_pack_rect_corners[i]);
          mesh.m_S.Append(ON_2dPoint::Midpoint(face_pack_rect_corners[i], face_pack_rect_corners[(i+1)%4]));
          if (bSetMeshT)
          {
            faceT[0] = faceT[1];
            faceT[1] = f->TexturePoint((i + 1) % 4);
            mesh.m_T.Append(ON_2fPoint(faceT[0]));
            mesh.m_T.Append(ON_2fPoint(ON_3dPoint::Midpoint(faceT[0], faceT[1])));
          }
        }

        // add 4 ON_Mesh quads that make up the ON_SubDFace quad
        mesh_f.vi[3] = four_gon->m_vi[7];
        for (unsigned i = 0; i < 4; ++i)
        {
          mesh_f.vi[1] = mesh_f.vi[3];
          mesh_f.vi[2] = four_gon->m_vi[2 * i];
          mesh_f.vi[3] = mesh_f.vi[2] + 1;
          mesh.m_F.Append(mesh_f);
          mesh.m_FN.Append(N);
        }

        // add an ON_MeshNgon that represents the ON_SubDFace quad
        mesh.AddNgon(four_gon);
      }
      else
      {
        quadP[3] = ON_3dPoint::Midpoint(P[n - 1], P[0]);
        if (bSetMeshT)
          quadT[3] = ON_3dPoint::Midpoint(faceT[0], faceT[1]);


        const ON_2udex ngon_grid_size
          = (n >= 5)
          ? ON_SubDFace::GetNgonSubPackRectSizeAndDelta(n, face_pack_rect_size, ngon_sub_pack_rect_size, ngon_sub_pack_rect_delta)
          : ON_2udex::Zero;

        // an ON_Mesh n-gon is not possible because the fake packed surface parameters are not continuous across the ON_SubD face.
        for (unsigned i = 0; i < n; ++i)
        {
          if (3 == n)
          {
            ON_SubDMeshFragment::Get3gonFaceFragmentPackRectCorners(false, face_pack_rect_corners, i, false, quadS);
          }
          else
          {
            ON_SubDMeshFragment::GetNgonFaceFragmentPackRectCorners(
              n,
              i,
              false,
              face_pack_rect_corners,
              face_pack_rect_size,
              ngon_grid_size,
              ngon_sub_pack_rect_size,
              ngon_sub_pack_rect_delta,
              quadS
            );
          }

          quadP[1] = quadP[3];
          quadP[2] = P[i];
          quadP[3] = ON_3dPoint::Midpoint(P[i], P[(i + 1) % n]);
          if (bSetMeshT)
          {
            faceT[0] = faceT[1];
            faceT[1] = f->TexturePoint((i + 1) % n);
            quadT[1] = quadT[3];
            quadT[2] = faceT[0];
            quadT[3] = ON_3dPoint::Midpoint(faceT[0], faceT[1]);
          }

          mesh_f.vi[0] = D.UnsignedCount();
          mesh_f.vi[1] = mesh_f.vi[0] + 1;
          mesh_f.vi[2] = mesh_f.vi[1] + 1;
          mesh_f.vi[3] = mesh_f.vi[2] + 1;

          for (unsigned j = 0; j < 4U; ++j)
          {
            D.Append(quadP[j]);
            mesh.m_N.Append(N);
            mesh.m_S.Append(quadS[j]);
            if (bSetMeshT)
              mesh.m_T.Append(ON_2fPoint(quadT[j]));
          }
          mesh.m_F.Append(mesh_f);
          mesh.m_FN.Append(N);
        }
      }
    }
  }
  else
  {
    // All SubD faces are quads
    for (const ON_SubDFace* f = level.m_face[0]; nullptr != f; f = f->m_next_face)
    {
      if (4 != f->m_edge_count)
        continue;
      quadP[3].x = ON_DBL_QNAN;
      for (unsigned i = 0; i < 4; ++i)
      {
        const ON_SubDVertex* v = f->Vertex(i);
        if (nullptr == v)
          break;
        quadP[i] = v->ControlNetPoint();
        if (false == quadP[i].IsValid())
          break;
      }
      if (false == quadP[3].IsValid())
        continue;
      const ON_3fVector N(f->ControlNetCenterNormal());
      mesh_f.vi[0] = D.UnsignedCount();
      mesh_f.vi[1] = mesh_f.vi[0] + 1;
      mesh_f.vi[2] = mesh_f.vi[1] + 1;
      mesh_f.vi[3] = mesh_f.vi[2] + 1;
      mesh.m_F.Append(mesh_f);
      mesh.m_FN.Append(N);
      for (unsigned i = 0; i < 4U; ++i)
      {
        D.Append(quadP[i]);
        mesh.m_N.Append(N);
        mesh.m_S.Append(f->PackRectCorner(false, i));
        if (bSetMeshT)
          mesh.m_T.Append(ON_2fPoint(f->TexturePoint(i)));
      }
    }
  }


  ON_MappingTag mapping_tag = this->TextureMappingTag(false);

  if (mesh.m_S.UnsignedCount() != D.UnsignedCount())
  {
    mesh.m_S.Destroy();
    if (ON_TextureMapping::TYPE::srfp_mapping == mapping_tag.m_mapping_type)
      mapping_tag = ON_MappingTag::Unset;
  }
  else
  {
    // set fake surface mapping information
    mesh.m_srf_domain[0] = ON_Interval::ZeroToOne;
    mesh.m_srf_domain[1] = ON_Interval::ZeroToOne;
    mesh.m_srf_scale[0] = 0.0;
    mesh.m_srf_scale[1] = 0.0;
    mesh.m_packed_tex_domain[0] = ON_Interval::ZeroToOne;
    mesh.m_packed_tex_domain[1] = ON_Interval::ZeroToOne;
    mesh.m_packed_tex_rotate = false;

    if (
      false == bSetMeshT
      && (false == mapping_tag.IsSet() || mapping_tag.IsDefaultSurfaceParameterMapping())
      )
    {
      const int count = mesh.m_S.Count();
      mesh.m_T.Reserve(count);
      mesh.m_T.SetCount(0);
      for (int i = 0; i < count; ++i)
        mesh.m_T.Append(ON_2fPoint(mesh.m_S[i]));
    }
  }

  if (bSetMeshT)
  {
    if (mesh.m_T.UnsignedCount() != D.UnsignedCount())
      mesh.m_T.Destroy();
  }
  mesh.m_Ttag = mapping_tag;

  return true;
}